

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_pythonBindingFunctionsCoverage_Test::TestBody
          (Annotator_pythonBindingFunctionsCoverage_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  element_type *peVar4;
  AssertHelper local_4c8 [8];
  Message local_4c0 [15];
  allocator<char> local_4b1;
  string local_4b0 [39];
  allocator<char> local_489;
  string local_488 [32];
  shared_ptr<libcellml::Component> local_468;
  shared_ptr<libcellml::Variable> local_458;
  allocator<char> local_441;
  string local_440 [39];
  allocator<char> local_419;
  string local_418 [32];
  shared_ptr<libcellml::Component> local_3f8;
  shared_ptr<libcellml::Variable> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_5;
  Message local_3a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_4;
  Message local_360 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_3;
  Message local_320 [15];
  allocator<char> local_311;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [32];
  shared_ptr<libcellml::Component> local_2c8;
  shared_ptr<libcellml::Variable> local_2b8;
  allocator<char> local_2a1;
  string local_2a0 [39];
  allocator<char> local_279;
  string local_278 [32];
  shared_ptr<libcellml::Component> local_258;
  shared_ptr<libcellml::Variable> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_2;
  Message local_200 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  Message local_1c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [32];
  shared_ptr<libcellml::Component> local_138;
  shared_ptr<libcellml::Variable> local_128;
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [32];
  shared_ptr<libcellml::Component> local_c8;
  string local_b8 [16];
  undefined1 local_a8 [8];
  VariablePairPtr itemConnection;
  string local_90 [32];
  shared_ptr<libcellml::Units> local_70;
  undefined1 local_60 [8];
  UnitsItemPtr itemUnitsItem;
  undefined1 local_40 [8];
  ModelPtr model;
  AnnotatorPtr annotator;
  ParserPtr parser;
  Annotator_pythonBindingFunctionsCoverage_Test *this_local;
  
  this_00 = &annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  libcellml::Annotator::create();
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel((string *)local_40);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"units2",
             (allocator<char> *)
             ((long)&itemConnection.
                     super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Model::units((string *)&local_70);
  libcellml::UnitsItem::create((shared_ptr *)local_60,(ulong)&local_70);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&itemConnection.
                     super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"component2",&local_e9);
  libcellml::ComponentEntity::component((string *)&local_c8,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"variable1",&local_111);
  libcellml::Component::variable(local_b8);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"component3",&local_159);
  libcellml::ComponentEntity::component((string *)&local_138,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_180,"variable1",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::Component::variable((string *)&local_128);
  libcellml::VariablePair::create((shared_ptr *)local_a8,(shared_ptr *)local_b8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_128);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_138);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_b8);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_1b8);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_198,"\"\"","annotator->assignId(itemUnitsItem)",
             (char (*) [1])0x19fc0a,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(local_1c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x825,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_1f8,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_1d8,"\"\"",
             "annotator->assignId(itemConnection, libcellml::CellmlElementType::CONNECTION)",
             (char (*) [1])0x19fc0a,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x826,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_278,"component2",&local_279);
  libcellml::ComponentEntity::component((string *)&local_258,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"variable1",&local_2a1);
  libcellml::Component::variable((string *)&local_248);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e8,"component3",&local_2e9);
  libcellml::ComponentEntity::component((string *)&local_2c8,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_2c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_310,"variable1",&local_311);
  libcellml::Component::variable((string *)&local_2b8);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_238,(shared_ptr *)peVar4,(CellmlElementType)&local_248);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_218,"\"\"",
             "annotator->assignId(model->component(\"component2\")->variable(\"variable1\"), model->component(\"component3\")->variable(\"variable1\"))"
             ,(char (*) [1])0x19fc0a,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_2b8);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator(&local_311);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_2c8);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_248);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_258);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(local_320);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x827,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::setModel((shared_ptr *)peVar4);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_358);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_338,"\"b4da55\"","annotator->assignId(itemUnitsItem)",
             (char (*) [7])"b4da55",&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(local_360);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x82c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_398,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_378,"\"b4da56\"",
             "annotator->assignId(itemConnection, libcellml::CellmlElementType::CONNECTION)",
             (char (*) [7])"b4da56",&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(local_3a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x82d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_418,"component2",&local_419);
  libcellml::ComponentEntity::component((string *)&local_3f8,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_440,"variable1",&local_441);
  libcellml::Component::variable((string *)&local_3e8);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_488,"component3",&local_489);
  libcellml::ComponentEntity::component((string *)&local_468,SUB81(peVar2,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4b0,"variable1",&local_4b1);
  libcellml::Component::variable((string *)&local_458);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_3d8,(shared_ptr *)peVar4,(CellmlElementType)&local_3e8);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_3b8,"\"b4da57\"",
             "annotator->assignId(model->component(\"component2\")->variable(\"variable1\"), model->component(\"component3\")->variable(\"variable1\"))"
             ,(char (*) [7])"b4da57",&local_3d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_458);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_468);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator(&local_489);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_3e8);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator(&local_441);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_3f8);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator(&local_419);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(local_4c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              (local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x82e,pcVar3);
    testing::internal::AssertHelper::operator=(local_4c8,local_4c0);
    testing::internal::AssertHelper::~AssertHelper(local_4c8);
    testing::Message::~Message(local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_a8);
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr((shared_ptr<libcellml::UnitsItem> *)local_60);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_40);
  std::shared_ptr<libcellml::Annotator>::~shared_ptr
            ((shared_ptr<libcellml::Annotator> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Annotator, pythonBindingFunctionsCoverage)
{
    // Several functions are provided so that bindings are easier to use.
    // This test is to provide coverage for those rather than to demonstrate functionality.

    auto parser = libcellml::Parser::create();
    auto annotator = libcellml::Annotator::create();
    auto model = parser->parseModel(modelStringNoIds);

    auto itemUnitsItem = libcellml::UnitsItem::create(model->units("units2"), 0);
    auto itemConnection = libcellml::VariablePair::create(
        model->component("component2")->variable("variable1"),
        model->component("component3")->variable("variable1"));

    // Expect failure as no model is built.
    EXPECT_EQ("", annotator->assignId(itemUnitsItem));
    EXPECT_EQ("", annotator->assignId(itemConnection, libcellml::CellmlElementType::CONNECTION));
    EXPECT_EQ("", annotator->assignId(model->component("component2")->variable("variable1"), model->component("component3")->variable("variable1")));

    annotator->setModel(model);

    // Expect success.
    EXPECT_EQ("b4da55", annotator->assignId(itemUnitsItem));
    EXPECT_EQ("b4da56", annotator->assignId(itemConnection, libcellml::CellmlElementType::CONNECTION));
    EXPECT_EQ("b4da57", annotator->assignId(model->component("component2")->variable("variable1"), model->component("component3")->variable("variable1")));
}